

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

WaveAudioDescriptor *
get_descriptor_by_type<AS_02::PCM::MXFReader,ASDCP::MXF::WaveAudioDescriptor>
          (MXFReader *reader,UL *type_ul)

{
  long *plVar1;
  WaveAudioDescriptor *pWVar2;
  InterchangeObject *obj;
  long local_88;
  Result_t local_80 [104];
  
  local_88 = 0;
  plVar1 = (long *)(**(code **)(*(long *)reader + 0x10))();
  (**(code **)(*plVar1 + 0xa8))(local_80,plVar1,(type_ul->super_Identifier<16U>).m_Value,&local_88);
  Kumu::Result_t::~Result_t(local_80);
  if (local_88 == 0) {
    pWVar2 = (WaveAudioDescriptor *)0x0;
  }
  else {
    pWVar2 = (WaveAudioDescriptor *)
             __dynamic_cast(local_88,&ASDCP::MXF::InterchangeObject::typeinfo,
                            &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  }
  return pWVar2;
}

Assistant:

DescriptorType *get_descriptor_by_type(ReaderType& reader, const UL& type_ul)
{
  InterchangeObject *obj = 0;
  reader.OP1aHeader().GetMDObjectByType(type_ul.Value(), &obj);
  return dynamic_cast<DescriptorType*>(obj);
}